

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

bool __thiscall
MeCab::anon_unknown_0::TaggerImpl::parseNBestInit(TaggerImpl *this,char *str,size_t len)

{
  uint uVar1;
  Lattice *pLVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  TaggerImpl *in_RDI;
  bool bVar3;
  Lattice *lattice;
  char *in_stack_ffffffffffffffc8;
  
  pLVar2 = mutable_lattice(in_RDI);
  (*pLVar2->_vptr_Lattice[10])(pLVar2,in_RSI,in_RDX);
  initRequestType(in_RDI);
  (*pLVar2->_vptr_Lattice[0x14])(pLVar2,2);
  uVar1 = (**(in_RDI->super_Tagger)._vptr_Tagger)(in_RDI,pLVar2);
  bVar3 = (uVar1 & 1) != 0;
  if (!bVar3) {
    (*pLVar2->_vptr_Lattice[0x24])();
    set_what(in_RDI,in_stack_ffffffffffffffc8);
  }
  return bVar3;
}

Assistant:

bool TaggerImpl::parseNBestInit(const char *str, size_t len) {
  Lattice *lattice = mutable_lattice();
  lattice->set_sentence(str, len);
  initRequestType();
  lattice->add_request_type(MECAB_NBEST);
  if (!parse(lattice)) {
    set_what(lattice->what());
    return false;
  }
  return true;
}